

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

Element * __thiscall
Rml::ElementDocument::FindNextTabElement
          (ElementDocument *this,Element *current_element,bool forward)

{
  bool bVar1;
  int iVar2;
  CanFocus CVar3;
  Element *pEVar4;
  Element *pEVar5;
  int local_9c;
  int local_98;
  Element *result_2;
  int local_78;
  int child_index_1;
  int i_2;
  int num_children;
  Element *result_1;
  Element *search_child;
  int local_58;
  int child_index;
  int i_1;
  int num_children_1;
  Element *parent;
  Element *child;
  Element *document;
  bool search_enabled;
  Element *result;
  int i;
  bool forward_local;
  Element *current_element_local;
  ElementDocument *this_local;
  
  if (forward) {
    for (result._0_4_ = 0; iVar2 = Element::GetNumChildren(current_element,false),
        (int)result < iVar2; result._0_4_ = (int)result + 1) {
      pEVar4 = Element::GetChild(current_element,(int)result);
      pEVar4 = SearchFocusSubtree(this,pEVar4,forward);
      if (pEVar4 != (Element *)0x0) {
        return pEVar4;
      }
    }
  }
  this_local = Element::GetOwnerDocument(current_element);
  _i_1 = Element::GetParentNode(current_element);
  parent = current_element;
  while (bVar1 = false, (ElementDocument *)parent != this_local) {
    iVar2 = Element::GetNumChildren(_i_1,false);
    for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
      if (forward) {
        local_98 = local_58;
      }
      else {
        local_98 = (iVar2 - local_58) + -1;
      }
      pEVar4 = Element::GetChild(_i_1,local_98);
      if ((bVar1) && (pEVar5 = SearchFocusSubtree(this,pEVar4,forward), pEVar5 != (Element *)0x0)) {
        return pEVar5;
      }
      if (pEVar4 == parent) {
        bVar1 = true;
      }
    }
    parent = _i_1;
    _i_1 = Element::GetParentNode(_i_1);
  }
  if (((ElementDocument *)current_element == this_local) ||
     (CVar3 = anon_unknown_0::CanFocusElement(&this_local->super_Element), CVar3 != Yes)) {
    iVar2 = Element::GetNumChildren(&this_local->super_Element,false);
    for (local_78 = 0; local_78 < iVar2; local_78 = local_78 + 1) {
      if (forward) {
        local_9c = local_78;
      }
      else {
        local_9c = (iVar2 - local_78) + -1;
      }
      pEVar4 = Element::GetChild(&this_local->super_Element,local_9c);
      pEVar4 = SearchFocusSubtree(this,pEVar4,forward);
      if (pEVar4 != (Element *)0x0) {
        return pEVar4;
      }
    }
    this_local = (ElementDocument *)0x0;
  }
  return &this_local->super_Element;
}

Assistant:

Element* ElementDocument::FindNextTabElement(Element* current_element, bool forward)
{
	// This algorithm is quite sneaky, I originally thought a depth first search would work, but it appears not. What is
	// required is to cut the tree in half along the nodes from current_element up the root and then either traverse the
	// tree in a clockwise or anticlock wise direction depending if you're searching forward or backward respectively.

	// If we're searching forward, check the immediate children of this node first off.
	if (forward)
	{
		for (int i = 0; i < current_element->GetNumChildren(); i++)
			if (Element* result = SearchFocusSubtree(current_element->GetChild(i), forward))
				return result;
	}

	// Now walk up the tree, testing either the bottom or top
	// of the tree, depending on whether we're going forward
	// or backward respectively.
	bool search_enabled = false;
	Element* document = current_element->GetOwnerDocument();
	Element* child = current_element;
	Element* parent = current_element->GetParentNode();
	while (child != document)
	{
		const int num_children = parent->GetNumChildren();
		for (int i = 0; i < num_children; i++)
		{
			// Calculate index into children
			const int child_index = forward ? i : (num_children - i - 1);
			Element* search_child = parent->GetChild(child_index);

			// Do a search if its enabled
			if (search_enabled)
				if (Element* result = SearchFocusSubtree(search_child, forward))
					return result;

			// Enable searching when we reach the child.
			if (search_child == child)
				search_enabled = true;
		}

		// Advance up the tree
		child = parent;
		parent = parent->GetParentNode();
		search_enabled = false;
	}

	// We could not find anything to focus along this direction.

	// If we can focus the document, then focus that now.
	if (current_element != document && CanFocusElement(document) == CanFocus::Yes)
		return document;

	// Otherwise, search the entire document tree. This way we will wrap around.
	const int num_children = document->GetNumChildren();
	for (int i = 0; i < num_children; i++)
	{
		const int child_index = forward ? i : (num_children - i - 1);
		if (Element* result = SearchFocusSubtree(document->GetChild(child_index), forward))
			return result;
	}

	return nullptr;
}